

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grid.h
# Opt level: O2

Range<float,_2> __thiscall Nova::Grid<float,_2>::Cell_Domain(Grid<float,_2> *this,T_INDEX *index)

{
  Vector<int,_2,_true> *in_RDX;
  TV extraout_XMM0_Qa;
  T_STORAGE in_XMM1_Qa;
  Range<float,_2> RVar1;
  Vector<float,_2,_true> data_copy;
  TV corner;
  T_STORAGE local_40;
  T_STORAGE local_38;
  T_STORAGE local_30;
  
  Vector<float,_2,_true>::Vector<int>((Vector<float,_2,_true> *)&local_38,in_RDX);
  local_40._M_elems[0] = local_38._M_elems[0];
  local_40._M_elems[1] = local_38._M_elems[1];
  Vector<float,_2,_true>::operator*=
            ((Vector<float,_2,_true> *)&local_40,(Vector<float,_2,_true> *)(index + 3));
  Vector<float,_2,_true>::operator+
            ((Vector<float,_2,_true> *)&local_30,(Vector<float,_2,_true> *)(index + 1));
  local_40._M_elems[0] = local_30._M_elems[0];
  local_40._M_elems[1] = local_30._M_elems[1];
  Vector<float,_2,_true>::operator-=
            ((Vector<float,_2,_true> *)&local_40,(Vector<float,_2,_true> *)(index + 3));
  *(_Type *)(this->counts)._data._M_elems = local_40._M_elems;
  *&(this->domain).min_corner._data._M_elems = local_30._M_elems;
  RVar1.max_corner._data._M_elems = (T_STORAGE)(T_STORAGE)in_XMM1_Qa._M_elems;
  RVar1.min_corner._data._M_elems = extraout_XMM0_Qa._data._M_elems;
  return RVar1;
}

Assistant:

Range<T,d> Cell_Domain(const T_INDEX& index) const
    {
        TV corner=domain.min_corner+TV(index)*dX;
        return Range<T,d>(corner-dX,corner);
    }